

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::addCols
          (SPxLPBase<double> *this,SPxColId *id,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  undefined3 in_register_00000009;
  long lVar2;
  DataKey local_38;
  DataKey local_30;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar2 = (long)iVar1;
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])
            (this,set,(ulong)CONCAT31(in_register_00000009,scale));
  if (iVar1 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    do {
      local_38 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar2];
      SPxColId::SPxColId((SPxColId *)&local_30,&local_38);
      *id = (SPxColId)local_30;
      lVar2 = lVar2 + 1;
      id = (SPxColId *)(&id->super_DataKey + 1);
    } while (lVar2 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  return;
}

Assistant:

virtual void addCols(SPxColId id[], const LPColSetBase<R>& set, bool scale = false)
   {

      int i = nCols();
      addCols(set, scale);

      for(int j = 0; i < nCols(); ++i, ++j)
         id[j] = cId(i);
   }